

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

size_t __thiscall
wasm::
SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
::count(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        *this,LocalSet **x)

{
  ulong uVar1;
  ulong uVar2;
  size_type sVar3;
  ulong uVar4;
  
  if ((this->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    sVar3 = std::
            set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>::
            count(&this->flexible,x);
    return sVar3;
  }
  uVar1 = (this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar1 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while ((this->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems[uVar4] != *x
          );
  return (ulong)(uVar4 < uVar1);
}

Assistant:

size_t count(const T& x) const {
    if (usingFixed()) {
      // Do a linear search.
      for (size_t i = 0; i < fixed.used; i++) {
        if (fixed.storage[i] == x) {
          return 1;
        }
      }
      return 0;
    } else {
      return flexible.count(x);
    }
  }